

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::removeMask(Image *this)

{
  uint8 *puVar1;
  int32 i;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint8 *puVar6;
  
  iVar5 = this->depth;
  if (iVar5 < 9) {
    uVar3 = 0;
    do {
      this->palette[uVar3 + 3] = 0xff;
      uVar3 = uVar3 + 4;
    } while (uVar3 < (ulong)(4L << ((byte)iVar5 & 0x3f)));
  }
  else if ((iVar5 != 0x18) && (iVar5 = this->height, 0 < iVar5)) {
    puVar1 = this->pixels;
    iVar4 = this->width;
    iVar2 = 0;
    do {
      if (0 < iVar4) {
        iVar5 = 0;
        puVar6 = puVar1;
        do {
          if (this->depth == 0x20) {
            puVar6[3] = 0xff;
            puVar6 = puVar6 + 4;
          }
          else if (this->depth == 0x10) {
            puVar6[1] = puVar6[1] | 0x80;
            puVar6 = puVar6 + 2;
          }
          iVar5 = iVar5 + 1;
          iVar4 = this->width;
        } while (iVar5 < iVar4);
        iVar5 = this->height;
      }
      puVar1 = puVar1 + this->stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 < iVar5);
  }
  return;
}

Assistant:

void
Image::removeMask(void)
{
	if(this->depth <= 8){
		assert(this->palette);
		int32 pallen = 4*(1 << this->depth);
		for(int32 i = 0; i < pallen; i += 4)
			this->palette[i+3] = 0xFF;
		return;
	}
	if(this->depth == 24)
		return;
	assert(this->pixels);
	uint8 *line = this->pixels;
	uint8 *p;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 16:
				p[1] |= 0x80;
				p += 2;
				break;
			case 32:
				p[3] = 0xFF;
				p += 4;
				break;
			}
		}
		line += this->stride;
	}
}